

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O0

void doctest::detail::logTestStart(char *name,char *file,uint line)

{
  ContextState *pCVar1;
  bool bVar2;
  char *pcVar3;
  ContextState **ppCVar4;
  size_type sVar5;
  reference pvVar6;
  String local_cb8;
  String local_cb0;
  String local_ca8;
  String local_ca0;
  String local_c98;
  String local_c90;
  String local_c88;
  String local_c80;
  String local_c78;
  Color local_c69;
  Color col_4;
  Color local_c59;
  char local_c58 [7];
  Color col_3;
  char subcase [1024];
  uint i;
  vector<doctest::detail::Subcase,_std::allocator<doctest::detail::Subcase>_> *subcasesStack;
  String subcaseStuff;
  Color col_2;
  Color col_1;
  Color local_829;
  char local_828 [7];
  Color col;
  char msg [1024];
  char loc [1024];
  char *newLine;
  uint line_local;
  char *file_local;
  char *name_local;
  
  pcVar3 = fileForOutput(file);
  snprintf(msg + 0x3f8,0x400,"%s(%d)\n",pcVar3,(ulong)line);
  snprintf(local_828,0x400,"%s\n",name);
  do {
    pcVar3 = getSeparator();
    if (*pcVar3 != '\0') {
      Color::Color(&local_829,Yellow);
      getSeparator();
      printf("%s");
      Color::~Color(&local_829);
    }
    bVar2 = always_false();
  } while (bVar2);
  do {
    if (msg[0x3f8] != '\0') {
      Color::Color((Color *)((long)&subcaseStuff.m_str + 3),LightGrey);
      printf("%s");
      Color::~Color((Color *)((long)&subcaseStuff.m_str + 3));
    }
    bVar2 = always_false();
  } while (bVar2);
  do {
    if (local_828[0] != '\0') {
      Color::Color((Color *)((long)&subcaseStuff.m_str + 2),None);
      printf("%s");
      Color::~Color((Color *)((long)&subcaseStuff.m_str + 2));
    }
    bVar2 = always_false();
  } while (bVar2);
  String::String((String *)&subcasesStack,"");
  ppCVar4 = getContextState();
  pCVar1 = *ppCVar4;
  subcase[0x3fc] = '\0';
  subcase[0x3fd] = '\0';
  subcase[0x3fe] = '\0';
  subcase[0x3ff] = '\0';
  for (; sVar5 = std::vector<doctest::detail::Subcase,_std::allocator<doctest::detail::Subcase>_>::
                 size(&pCVar1->subcasesStack), (uint)subcase._1020_4_ < sVar5;
      subcase._1020_4_ = subcase._1020_4_ + 1) {
    pvVar6 = std::vector<doctest::detail::Subcase,_std::allocator<doctest::detail::Subcase>_>::
             operator[](&pCVar1->subcasesStack,(ulong)(uint)subcase._1020_4_);
    snprintf(local_c58,0x400,"  %s\n",(pvVar6->m_signature).m_name);
    do {
      if (local_c58[0] != '\0') {
        Color::Color(&local_c59,None);
        printf("%s");
        Color::~Color(&local_c59);
      }
      bVar2 = always_false();
    } while (bVar2);
    String::String((String *)&stack0xfffffffffffff398,local_c58);
    String::operator+=((String *)&subcasesStack,(String *)&stack0xfffffffffffff398);
    String::~String((String *)&stack0xfffffffffffff398);
  }
  do {
    Color::Color(&local_c69,None);
    printf("%s");
    Color::~Color(&local_c69);
    bVar2 = always_false();
  } while (bVar2);
  pcVar3 = getSeparator();
  String::String(&local_c98,pcVar3);
  String::String(&local_ca0,msg + 0x3f8);
  String::operator+(&local_c90,&local_c98);
  String::String(&local_ca8,local_828);
  String::operator+(&local_c88,&local_c90);
  pcVar3 = String::c_str((String *)&subcasesStack);
  String::String(&local_cb0,pcVar3);
  String::operator+(&local_c80,&local_c88);
  String::String(&local_cb8,"\n");
  String::operator+(&local_c78,&local_c80);
  printToDebugConsole(&local_c78);
  String::~String(&local_c78);
  String::~String(&local_cb8);
  String::~String(&local_c80);
  String::~String(&local_cb0);
  String::~String(&local_c88);
  String::~String(&local_ca8);
  String::~String(&local_c90);
  String::~String(&local_ca0);
  String::~String(&local_c98);
  String::~String((String *)&subcasesStack);
  return;
}

Assistant:

void logTestStart(const char* name, const char* file, unsigned line) {
        const char* newLine = "\n";

        char loc[DOCTEST_SNPRINTF_BUFFER_LENGTH];
        DOCTEST_SNPRINTF(loc, DOCTEST_COUNTOF(loc), "%s(%d)\n", fileForOutput(file), line);

        char msg[DOCTEST_SNPRINTF_BUFFER_LENGTH];
        DOCTEST_SNPRINTF(msg, DOCTEST_COUNTOF(msg), "%s\n", name);

        DOCTEST_PRINTF_COLORED(getSeparator(), Color::Yellow);
        DOCTEST_PRINTF_COLORED(loc, Color::LightGrey);
        DOCTEST_PRINTF_COLORED(msg, Color::None);

        String                subcaseStuff  = "";
        std::vector<Subcase>& subcasesStack = getContextState()->subcasesStack;
        for(unsigned i = 0; i < subcasesStack.size(); ++i) {
            char subcase[DOCTEST_SNPRINTF_BUFFER_LENGTH];
            DOCTEST_SNPRINTF(subcase, DOCTEST_COUNTOF(loc), "  %s\n",
                             subcasesStack[i].m_signature.m_name);
            DOCTEST_PRINTF_COLORED(subcase, Color::None);
            subcaseStuff += subcase;
        }

        DOCTEST_PRINTF_COLORED(newLine, Color::None);

        printToDebugConsole(String(getSeparator()) + loc + msg + subcaseStuff.c_str() + newLine);
    }